

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

bool __thiscall cmCTest::UpdateCTestConfiguration(cmCTest *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  mapped_type *pmVar6;
  string fileName;
  string line;
  string local_6a0;
  string key;
  string value;
  ifstream fin;
  byte abStack_620 [488];
  ostringstream cmCTestLog_msg;
  undefined7 uStack_437;
  size_type local_430;
  
  if (this->SuppressUpdatingCTestConfiguration != false) {
    return true;
  }
  std::__cxx11::string::string((string *)&fileName,(string *)&this->CTestConfigFile);
  if (fileName._M_string_length == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCTestLog_msg,&this->BinaryDir,"/CTestConfiguration.ini");
    std::__cxx11::string::operator=((string *)&fileName,(string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    bVar1 = cmsys::SystemTools::FileExists(fileName._M_dataplus._M_p);
    if (!bVar1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCTestLog_msg,&this->BinaryDir,"/DartConfiguration.tcl");
      std::__cxx11::string::operator=((string *)&fileName,(string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"UpdateCTestConfiguration  from :");
  poVar4 = std::operator<<(poVar4,(string *)&fileName);
  std::operator<<(poVar4,"\n");
  std::__cxx11::stringbuf::str();
  Log(this,3,
      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx",
      0x2f7,_fin,false);
  std::__cxx11::string::~string((string *)&fin);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  bVar1 = cmsys::SystemTools::FileExists(fileName._M_dataplus._M_p);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"Parse Config file:");
    poVar4 = std::operator<<(poVar4,(string *)&fileName);
    std::operator<<(poVar4,"\n");
    std::__cxx11::stringbuf::str();
    Log(this,3,
        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
        ,0x305,_fin,false);
    std::__cxx11::string::~string((string *)&fin);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    std::ifstream::ifstream(&fin,fileName._M_dataplus._M_p,_S_in);
    lVar5 = *(long *)(_fin + -0x18);
    if ((abStack_620[lVar5] & 5) != 0) {
      std::ifstream::~ifstream(&fin);
LAB_002a1f9b:
      bVar1 = false;
      goto LAB_002a2326;
    }
    while ((abStack_620[lVar5] & 5) == 0) {
      cmCTestLog_msg = (ostringstream)0x0;
      std::istream::getline((char *)&fin,(long)&cmCTestLog_msg);
      std::__cxx11::string::string((string *)&key,(char *)&cmCTestLog_msg,(allocator *)&value);
      CleanString(&line,&key);
      std::__cxx11::string::~string((string *)&key);
      if (line._M_string_length != 0) {
        while (((abStack_620[*(long *)(_fin + -0x18)] & 5) == 0 &&
               (line._M_dataplus._M_p[line._M_string_length - 1] == '\\'))) {
          std::__cxx11::string::substr((ulong)&key,(ulong)&line);
          std::__cxx11::string::operator=((string *)&line,(string *)&key);
          std::__cxx11::string::~string((string *)&key);
          cmCTestLog_msg = (ostringstream)0x0;
          std::istream::getline((char *)&fin,(long)&cmCTestLog_msg);
          std::__cxx11::string::string
                    ((string *)&value,(char *)&cmCTestLog_msg,(allocator *)&local_6a0);
          CleanString(&key,&value);
          std::__cxx11::string::append((string *)&line);
          std::__cxx11::string::~string((string *)&key);
          std::__cxx11::string::~string((string *)&value);
        }
        if ((*line._M_dataplus._M_p != '#') &&
           (lVar5 = std::__cxx11::string::find_first_of((char *)&line,0x51da11), lVar5 != -1)) {
          std::__cxx11::string::substr((ulong)&key,(ulong)&line);
          std::__cxx11::string::substr((ulong)&local_6a0,(ulong)&line);
          CleanString(&value,&local_6a0);
          std::__cxx11::string::~string((string *)&local_6a0);
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&this->CTestConfiguration,&key);
          std::__cxx11::string::_M_assign((string *)pmVar6);
          std::__cxx11::string::~string((string *)&value);
          std::__cxx11::string::~string((string *)&key);
        }
      }
      std::__cxx11::string::~string((string *)&line);
      lVar5 = *(long *)(_fin + -0x18);
    }
    std::ifstream::close();
    std::ifstream::~ifstream(&fin);
  }
  else if (this->ProduceXML == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"Cannot find file: ");
    poVar4 = std::operator<<(poVar4,(string *)&fileName);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::stringbuf::str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
        ,0x2fe,_fin,false);
    std::__cxx11::string::~string((string *)&fin);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    goto LAB_002a1f9b;
  }
  std::__cxx11::string::string((string *)&fin,"BuildDirectory",(allocator *)&line);
  GetCTestConfiguration((string *)&cmCTestLog_msg,this,(string *)&fin);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&fin);
  if (local_430 != 0) {
    std::__cxx11::string::string((string *)&fin,"BuildDirectory",(allocator *)&line);
    GetCTestConfiguration((string *)&cmCTestLog_msg,this,(string *)&fin);
    std::__cxx11::string::operator=((string *)&this->BinaryDir,(string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&fin);
    cmsys::SystemTools::ChangeDirectory(&this->BinaryDir);
  }
  std::__cxx11::string::string((string *)&fin,"TimeOut",(allocator *)&line);
  GetCTestConfiguration((string *)&cmCTestLog_msg,this,(string *)&fin);
  iVar3 = atoi((char *)CONCAT71(uStack_437,cmCTestLog_msg));
  this->TimeOut = (double)iVar3;
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&fin);
  bVar1 = true;
  if (this->ProduceXML == true) {
    std::__cxx11::string::string((string *)&fin,"CompressSubmission",(allocator *)&line);
    GetCTestConfiguration((string *)&cmCTestLog_msg,this,(string *)&fin);
    bVar2 = cmSystemTools::IsOn((char *)CONCAT71(uStack_437,cmCTestLog_msg));
    this->CompressXMLFiles = bVar2;
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&fin);
  }
LAB_002a2326:
  std::__cxx11::string::~string((string *)&fileName);
  return bVar1;
}

Assistant:

bool cmCTest::UpdateCTestConfiguration()
{
  if ( this->SuppressUpdatingCTestConfiguration )
    {
    return true;
    }
  std::string fileName = this->CTestConfigFile;
  if ( fileName.empty() )
    {
    fileName = this->BinaryDir + "/CTestConfiguration.ini";
    if ( !cmSystemTools::FileExists(fileName.c_str()) )
      {
      fileName = this->BinaryDir + "/DartConfiguration.tcl";
      }
    }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, "UpdateCTestConfiguration  from :"
             << fileName << "\n");
  if ( !cmSystemTools::FileExists(fileName.c_str()) )
    {
    // No need to exit if we are not producing XML
    if ( this->ProduceXML )
      {
      cmCTestLog(this, ERROR_MESSAGE, "Cannot find file: " << fileName
        << std::endl);
      return false;
      }
    }
  else
    {
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, "Parse Config file:"
               << fileName << "\n");
    // parse the dart test file
    cmsys::ifstream fin(fileName.c_str());

    if(!fin)
      {
      return false;
      }

    char buffer[1024];
    while ( fin )
      {
      buffer[0] = 0;
      fin.getline(buffer, 1023);
      buffer[1023] = 0;
      std::string line = cmCTest::CleanString(buffer);
      if(line.empty())
        {
        continue;
        }
      while ( fin && (line[line.size()-1] == '\\') )
        {
        line = line.substr(0, line.size()-1);
        buffer[0] = 0;
        fin.getline(buffer, 1023);
        buffer[1023] = 0;
        line += cmCTest::CleanString(buffer);
        }
      if ( line[0] == '#' )
        {
        continue;
        }
      std::string::size_type cpos = line.find_first_of(":");
      if ( cpos == line.npos )
        {
        continue;
        }
      std::string key = line.substr(0, cpos);
      std::string value
        = cmCTest::CleanString(line.substr(cpos+1, line.npos));
      this->CTestConfiguration[key] = value;
      }
    fin.close();
    }
  if ( !this->GetCTestConfiguration("BuildDirectory").empty() )
    {
    this->BinaryDir = this->GetCTestConfiguration("BuildDirectory");
    cmSystemTools::ChangeDirectory(this->BinaryDir);
    }
  this->TimeOut = atoi(this->GetCTestConfiguration("TimeOut").c_str());
  if ( this->ProduceXML )
    {
    this->CompressXMLFiles = cmSystemTools::IsOn(
      this->GetCTestConfiguration("CompressSubmission").c_str());
    }
  return true;
}